

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fftpack.c
# Opt level: O2

int cmf5kb_(int *lot,int *ido,int *l1,int *na,double *cc,int *im1,int *in1,double *ch,int *im2,
           int *in2,double *wa)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  bool bVar15;
  uint uVar16;
  uint uVar17;
  int iVar18;
  int iVar19;
  ulong uVar20;
  uint uVar21;
  long lVar22;
  int iVar23;
  long lVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  long lVar30;
  long lVar31;
  long lVar32;
  long lVar33;
  long lVar34;
  int iVar35;
  long lVar36;
  long lVar37;
  long lVar38;
  int iVar39;
  long lVar40;
  long lVar41;
  long lVar42;
  double dVar43;
  double dVar44;
  double dVar45;
  double dVar46;
  double dVar47;
  double dVar48;
  double dVar49;
  double dVar50;
  double dVar51;
  double dVar52;
  double dVar53;
  double dVar54;
  double dVar55;
  double dVar56;
  int local_108;
  int local_104;
  int local_98;
  
  iVar3 = *ido;
  lVar22 = (long)iVar3;
  iVar4 = *in1;
  iVar23 = *l1;
  uVar21 = (iVar3 + 1) * iVar23;
  iVar29 = *in2;
  iVar5 = *im1;
  lVar33 = (long)iVar5;
  lVar30 = ((long)*lot + -1) * lVar33;
  lVar41 = lVar30 + 1;
  iVar35 = iVar3 * 5 + 1;
  iVar2 = ~uVar21 * iVar4 * 2 + -3;
  iVar26 = *im2;
  iVar27 = (int)lVar30;
  if ((lVar22 < 2) && (*na != 1)) {
    iVar26 = 0;
    iVar29 = 0;
    if (0 < iVar23) {
      iVar29 = iVar23;
    }
    iVar1 = (uVar21 + 1) * iVar4 * 2;
    iVar18 = ((iVar3 * 4 + 1) * iVar23 + 1) * iVar4 * 2;
    iVar6 = ((iVar3 * 3 + 1) * iVar23 + 1) * iVar4 * 2;
    iVar35 = (iVar35 * iVar23 + 1) * iVar4 * 2;
    iVar3 = ((iVar3 * 2 + 1) * iVar23 + 1) * iVar4 * 2;
    for (uVar20 = 1; uVar20 != iVar29 + 1; uVar20 = uVar20 + 1) {
      lVar22 = 1;
      iVar23 = iVar26;
      while( true ) {
        bVar15 = lVar22 <= lVar41;
        if (iVar5 < 0) {
          bVar15 = iVar27 < lVar22;
        }
        if (!bVar15) break;
        lVar32 = (long)(iVar3 + iVar23 + 2);
        dVar44 = cc[(long)iVar2 + lVar32 + 2];
        lVar42 = (long)(iVar35 + 2 + iVar23);
        dVar43 = cc[(long)iVar2 + lVar42 + 2];
        lVar37 = (long)(iVar6 + 2 + iVar23);
        dVar50 = cc[(long)iVar2 + lVar37 + 2];
        lVar34 = (long)(iVar18 + 2 + iVar23);
        dVar46 = cc[(long)iVar2 + lVar34 + 2];
        lVar24 = (long)(iVar3 + 3 + iVar23);
        dVar47 = cc[iVar2 + lVar24];
        lVar36 = (long)(iVar35 + 3 + iVar23);
        dVar49 = cc[iVar2 + lVar36];
        dVar53 = dVar47 + dVar49;
        lVar40 = (long)(iVar6 + 3 + iVar23);
        dVar54 = cc[iVar2 + lVar40];
        lVar31 = (long)(iVar18 + 3 + iVar23);
        dVar52 = cc[iVar2 + lVar31];
        dVar51 = dVar54 + dVar52;
        lVar38 = (long)(iVar1 + 3 + iVar23);
        dVar45 = cc[iVar2 + lVar38];
        lVar30 = (long)(iVar1 + 2 + iVar23);
        dVar48 = cc[(long)iVar2 + lVar30 + 2];
        cc[iVar2 + lVar38] = dVar53 + dVar45 + dVar51;
        dVar56 = dVar44 - dVar43;
        dVar44 = dVar44 + dVar43;
        dVar55 = dVar50 - dVar46;
        dVar50 = dVar50 + dVar46;
        dVar47 = dVar47 - dVar49;
        dVar54 = dVar54 - dVar52;
        dVar43 = dVar51 * -0.8090169943749475 + dVar53 * 0.3090169943749474 + dVar45;
        dVar52 = dVar50 * -0.8090169943749475 + dVar44 * 0.3090169943749474 + dVar48;
        cc[(long)iVar2 + lVar30 + 2] = dVar44 + dVar48 + dVar50;
        dVar46 = dVar51 * 0.3090169943749474 + dVar53 * -0.8090169943749475 + dVar45;
        dVar49 = dVar56 * 0.9510565162951536 + dVar55 * 0.5877852522924731;
        cc[iVar2 + lVar24] = dVar43 - dVar49;
        cc[iVar2 + lVar36] = dVar49 + dVar43;
        dVar43 = dVar50 * 0.3090169943749474 + dVar44 * -0.8090169943749475 + dVar48;
        dVar44 = dVar47 * 0.9510565162951536 + dVar54 * 0.5877852522924731;
        cc[(long)iVar2 + lVar32 + 2] = dVar44 + dVar52;
        dVar50 = dVar47 * 0.5877852522924731 + dVar54 * -0.9510565162951536;
        cc[(long)iVar2 + lVar37 + 2] = dVar50 + dVar43;
        dVar47 = dVar56 * 0.5877852522924731 + dVar55 * -0.9510565162951536;
        cc[iVar2 + lVar40] = dVar46 - dVar47;
        cc[iVar2 + lVar31] = dVar47 + dVar46;
        cc[(long)iVar2 + lVar34 + 2] = dVar43 - dVar50;
        cc[(long)iVar2 + lVar42 + 2] = dVar52 - dVar44;
        lVar22 = lVar22 + lVar33;
        iVar23 = iVar23 + iVar5 * 2;
      }
      iVar26 = iVar26 + iVar4 * 2;
    }
  }
  else {
    uVar16 = iVar3 * 5;
    uVar17 = ~uVar16;
    iVar1 = ~(iVar23 * 6) * iVar29 * 2 + -3;
    local_98 = (int)lVar41;
    iVar18 = 0;
    if (0 < iVar23) {
      iVar18 = iVar23;
    }
    iVar6 = (uVar21 + 1) * iVar4 * 2;
    iVar7 = ((iVar3 * 4 + 1) * iVar23 + 1) * iVar4 * 2;
    iVar8 = ((iVar3 * 3 + 1) * iVar23 + 1) * iVar4 * 2;
    iVar35 = (iVar35 * iVar23 + 1) * iVar4 * 2;
    iVar9 = ((iVar3 * 2 + 1) * iVar23 + 1) * iVar4 * 2;
    iVar10 = (iVar23 * 9 + 1) * iVar29 * 2;
    iVar11 = (iVar23 * 8 + 1) * iVar29 * 2;
    iVar12 = (iVar23 * 10 + 1) * iVar29 * 2;
    iVar13 = (iVar23 * 7 + 1) * iVar29 * 2;
    iVar14 = (iVar23 * 6 + 1U) * iVar29 * 2;
    iVar19 = 0;
    iVar25 = 0;
    for (uVar20 = 1; uVar20 != iVar18 + 1; uVar20 = uVar20 + 1) {
      lVar41 = 1;
      iVar39 = iVar19;
      iVar28 = iVar25;
      while( true ) {
        bVar15 = lVar41 <= local_98;
        if (iVar5 < 0) {
          bVar15 = iVar27 < lVar41;
        }
        if (!bVar15) break;
        dVar44 = cc[(long)iVar2 + (long)(iVar9 + iVar28 + 2) + 2];
        dVar43 = cc[(long)iVar2 + (long)(iVar35 + 2 + iVar28) + 2];
        dVar51 = dVar44 + dVar43;
        dVar50 = cc[(long)iVar2 + (long)(iVar8 + 2 + iVar28) + 2];
        dVar46 = cc[(long)iVar2 + (long)(iVar7 + 2 + iVar28) + 2];
        dVar45 = dVar50 + dVar46;
        dVar47 = cc[(long)iVar2 + (long)(iVar9 + 3 + iVar28)];
        dVar49 = cc[(long)iVar2 + (long)(iVar35 + 3 + iVar28)];
        dVar55 = dVar47 + dVar49;
        dVar54 = cc[(long)iVar2 + (long)(iVar8 + 3 + iVar28)];
        dVar52 = cc[(long)iVar2 + (long)(iVar7 + 3 + iVar28)];
        dVar48 = dVar54 + dVar52;
        lVar24 = (long)(iVar6 + 3 + iVar28);
        ch[(long)iVar1 + (long)(iVar14 + 3 + iVar39)] = cc[iVar2 + lVar24] + dVar55 + dVar48;
        lVar30 = (long)(iVar6 + 2 + iVar28);
        ch[(long)iVar1 + (long)(iVar14 + 2 + iVar39) + 2] =
             cc[(long)iVar2 + lVar30 + 2] + dVar51 + dVar45;
        dVar44 = dVar44 - dVar43;
        dVar50 = dVar50 - dVar46;
        dVar47 = dVar47 - dVar49;
        dVar54 = dVar54 - dVar52;
        dVar56 = dVar48 * -0.8090169943749475 + dVar55 * 0.3090169943749474 + cc[iVar2 + lVar24];
        dVar53 = dVar45 * -0.8090169943749475 +
                 dVar51 * 0.3090169943749474 + cc[(long)iVar2 + lVar30 + 2];
        dVar49 = dVar48 * 0.3090169943749474 + dVar55 * -0.8090169943749475 + cc[iVar2 + lVar24];
        dVar46 = dVar45 * 0.3090169943749474 +
                 dVar51 * -0.8090169943749475 + cc[(long)iVar2 + lVar30 + 2];
        dVar52 = dVar47 * 0.9510565162951536 + dVar54 * 0.5877852522924731;
        dVar43 = dVar44 * 0.9510565162951536 + dVar50 * 0.5877852522924731;
        dVar47 = dVar47 * 0.5877852522924731 + dVar54 * -0.9510565162951536;
        dVar44 = dVar44 * 0.5877852522924731 + dVar50 * -0.9510565162951536;
        ch[(long)iVar1 + (long)(iVar13 + 3 + iVar39)] = dVar56 - dVar43;
        ch[(long)iVar1 + (long)(iVar12 + 3 + iVar39)] = dVar43 + dVar56;
        ch[(long)iVar1 + (long)(iVar13 + 2 + iVar39) + 2] = dVar52 + dVar53;
        ch[(long)iVar1 + (long)(iVar11 + 2 + iVar39) + 2] = dVar47 + dVar46;
        ch[(long)iVar1 + (long)(iVar11 + 3 + iVar39)] = dVar49 - dVar44;
        ch[(long)iVar1 + (long)(iVar10 + 3 + iVar39)] = dVar44 + dVar49;
        ch[(long)iVar1 + (long)(iVar10 + 2 + iVar39) + 2] = dVar46 - dVar47;
        ch[(long)iVar1 + (long)(iVar12 + iVar39 + 2) + 2] = dVar53 - dVar52;
        lVar41 = lVar41 + lVar33;
        iVar28 = iVar28 + iVar5 * 2;
        iVar39 = iVar39 + iVar26 * 2;
      }
      iVar25 = iVar25 + iVar4 * 2;
      iVar19 = iVar19 + iVar29 * 2;
    }
    if (iVar3 != 1) {
      iVar6 = ((iVar3 + 2) * iVar23 + 1) * iVar4 * 2;
      iVar7 = ((iVar3 * 4 + 2) * iVar23 + 1) * iVar4 * 2;
      iVar8 = ((iVar3 * 3 + 2) * iVar23 + 1) * iVar4 * 2;
      iVar9 = ((uVar16 + 2) * iVar23 + 1) * iVar4 * 2;
      iVar10 = ((iVar3 * 2 + 2) * iVar23 + 1) * iVar4 * 2;
      iVar35 = (iVar23 * 0xf + 1) * iVar29 * 2;
      iVar11 = (iVar23 * 0xe + 1) * iVar29 * 2;
      iVar12 = (iVar23 * 0xd + 1) * iVar29 * 2;
      iVar13 = (iVar23 * 0xc + 1) * iVar29 * 2;
      iVar14 = (iVar23 * 0xb + 1) * iVar29 * 2;
      local_104 = 0;
      local_108 = 0;
      for (lVar41 = 2; lVar41 <= lVar22; lVar41 = lVar41 + 1) {
        iVar19 = local_104;
        iVar25 = local_108;
        for (uVar20 = 1; uVar20 != iVar18 + 1; uVar20 = uVar20 + 1) {
          lVar30 = 1;
          iVar28 = iVar19;
          iVar39 = iVar25;
          while( true ) {
            bVar15 = lVar30 <= local_98;
            if (iVar5 < 0) {
              bVar15 = iVar27 < lVar30;
            }
            if (!bVar15) break;
            dVar44 = cc[(long)iVar2 + (long)(iVar10 + iVar39 + 2) + 2];
            dVar43 = cc[(long)iVar2 + (long)(iVar9 + 2 + iVar39) + 2];
            dVar48 = dVar44 + dVar43;
            dVar50 = cc[(long)iVar2 + (long)(iVar8 + 2 + iVar39) + 2];
            dVar46 = cc[(long)iVar2 + (long)(iVar7 + 2 + iVar39) + 2];
            dVar45 = dVar50 + dVar46;
            dVar47 = cc[(long)iVar2 + (long)(iVar10 + 3 + iVar39)];
            dVar49 = cc[(long)iVar2 + (long)(iVar9 + 3 + iVar39)];
            dVar55 = dVar47 + dVar49;
            dVar54 = cc[(long)iVar2 + (long)(iVar8 + 3 + iVar39)];
            dVar52 = cc[(long)iVar2 + (long)(iVar7 + 3 + iVar39)];
            dVar51 = dVar54 + dVar52;
            lVar37 = (long)(iVar6 + 3 + iVar39);
            ch[(long)iVar1 + (long)(iVar14 + 3 + iVar28)] = cc[iVar2 + lVar37] + dVar55 + dVar51;
            lVar24 = (long)(iVar6 + 2 + iVar39);
            ch[(long)iVar1 + (long)(iVar14 + 2 + iVar28) + 2] =
                 cc[(long)iVar2 + lVar24 + 2] + dVar48 + dVar45;
            dVar44 = dVar44 - dVar43;
            dVar50 = dVar50 - dVar46;
            dVar47 = dVar47 - dVar49;
            dVar54 = dVar54 - dVar52;
            dVar53 = dVar51 * -0.8090169943749475 + dVar55 * 0.3090169943749474 + cc[iVar2 + lVar37]
            ;
            dVar56 = dVar45 * -0.8090169943749475 +
                     dVar48 * 0.3090169943749474 + cc[(long)iVar2 + lVar24 + 2];
            dVar52 = dVar51 * 0.3090169943749474 + dVar55 * -0.8090169943749475 + cc[iVar2 + lVar37]
            ;
            dVar46 = dVar45 * 0.3090169943749474 +
                     dVar48 * -0.8090169943749475 + cc[(long)iVar2 + lVar24 + 2];
            dVar49 = dVar47 * 0.9510565162951536 + dVar54 * 0.5877852522924731;
            dVar43 = dVar44 * 0.9510565162951536 + dVar50 * 0.5877852522924731;
            dVar47 = dVar47 * 0.5877852522924731 + dVar54 * -0.9510565162951536;
            dVar44 = dVar44 * 0.5877852522924731 + dVar50 * -0.9510565162951536;
            dVar45 = dVar52 - dVar44;
            dVar44 = dVar44 + dVar52;
            dVar54 = dVar47 + dVar46;
            dVar46 = dVar46 - dVar47;
            dVar50 = dVar43 + dVar53;
            dVar53 = dVar53 - dVar43;
            dVar43 = dVar56 - dVar49;
            dVar49 = dVar49 + dVar56;
            ch[(long)iVar1 + (long)(iVar13 + 3 + iVar28)] =
                 wa[(long)(int)uVar17 + lVar41 + (int)uVar16] * dVar53 -
                 wa[(long)(int)uVar17 + lVar22 * 9 + lVar41] * dVar49;
            ch[(long)iVar1 + (long)(iVar13 + 2 + iVar28) + 2] =
                 dVar49 * wa[(long)(int)uVar17 + lVar41 + (int)uVar16] +
                 dVar53 * wa[(long)(int)uVar17 + lVar22 * 9 + lVar41];
            ch[(long)iVar1 + (long)(iVar12 + 3 + iVar28)] =
                 wa[(long)(int)uVar17 + lVar22 * 6 + lVar41] * dVar45 -
                 wa[(long)(int)uVar17 + lVar22 * 10 + lVar41] * dVar54;
            ch[(long)iVar1 + (long)(iVar12 + 2 + iVar28) + 2] =
                 dVar54 * wa[(long)(int)uVar17 + lVar22 * 6 + lVar41] +
                 dVar45 * wa[(long)(int)uVar17 + lVar22 * 10 + lVar41];
            ch[(long)iVar1 + (long)(iVar11 + 3 + iVar28)] =
                 wa[(long)(int)uVar17 + lVar22 * 7 + lVar41] * dVar44 -
                 wa[(long)(int)uVar17 + lVar22 * 0xb + lVar41] * dVar46;
            ch[(long)iVar1 + (long)(iVar11 + 2 + iVar28) + 2] =
                 dVar46 * wa[(long)(int)uVar17 + lVar22 * 7 + lVar41] +
                 dVar44 * wa[(long)(int)uVar17 + lVar22 * 0xb + lVar41];
            ch[(long)iVar1 + (long)(iVar35 + 3 + iVar28)] =
                 wa[(long)(int)uVar17 + iVar3 * 8 + lVar41] * dVar50 -
                 wa[(long)(int)uVar17 + lVar22 * 0xc + lVar41] * dVar43;
            ch[(long)iVar1 + (long)(iVar35 + 2 + iVar28) + 2] =
                 dVar43 * wa[(long)(int)uVar17 + iVar3 * 8 + lVar41] +
                 dVar50 * wa[(long)(int)uVar17 + lVar22 * 0xc + lVar41];
            lVar30 = lVar30 + lVar33;
            iVar39 = iVar39 + iVar5 * 2;
            iVar28 = iVar28 + iVar26 * 2;
          }
          iVar25 = iVar25 + iVar4 * 2;
          iVar19 = iVar19 + iVar29 * 2;
        }
        local_108 = local_108 + iVar4 * iVar23 * 2;
        local_104 = local_104 + iVar29 * iVar23 * 10;
      }
    }
  }
  return 0;
}

Assistant:

int cmf5kb_(int *lot, int *ido, int *l1, int
	*na, fft_real_t *cc, int *im1, int *in1, fft_real_t *ch, int *im2,
	int *in2, fft_real_t *wa)
{
    /* Initialized data */

     fft_real_t tr11 = .3090169943749474;
     fft_real_t ti11 = .9510565162951536;
     fft_real_t tr12 = -.8090169943749474;
     fft_real_t ti12 = .5877852522924731;

    /* System generated locals */
    int cc_dim2, cc_dim3, cc_dim4, cc_offset, ch_dim2, ch_dim3, ch_offset,
	     wa_dim1, wa_offset, i__1, i__2, i__3, i__4;

    /* Local variables */
     int i__, k, m1, m2;
     fft_real_t ci2, ci3, ci4, ci5;
     int m1d;
     fft_real_t di3, di4, di5, di2, cr2, cr3, cr5, cr4, ti2, ti3, ti4;
     int m2s;
     fft_real_t ti5, dr3, dr4, dr5, dr2, tr2, tr3, tr4, tr5, chold1, chold2;

    /* Parameter adjustments */
    wa_dim1 = *ido;
    wa_offset = 1 + wa_dim1 * 5;
    wa -= wa_offset;
    cc_dim2 = *in1;
    cc_dim3 = *l1;
    cc_dim4 = *ido;
    cc_offset = 1 + 2 * (1 + cc_dim2 * (1 + cc_dim3 * (1 + cc_dim4)));
    cc -= cc_offset;
    ch_dim2 = *in2;
    ch_dim3 = *l1;
    ch_offset = 1 + 2 * (1 + ch_dim2 * (1 + ch_dim3 * 6));
    ch -= ch_offset;

    /* Function Body */

/* FFTPACK 5.0 auxiliary routine */

    m1d = (*lot - 1) * *im1 + 1;
    m2s = 1 - *im2;
    if (*ido > 1 || *na == 1) {
	goto L102;
    }
    i__1 = *l1;
    for (k = 1; k <= i__1; ++k) {
	i__2 = m1d;
	i__3 = *im1;
	for (m1 = 1; i__3 < 0 ? m1 >= i__2 : m1 <= i__2; m1 += i__3) {
	    ti5 = cc[(m1 + (k + ((cc_dim4 << 1) + 1) * cc_dim3) * cc_dim2 <<
		    1) + 2] - cc[(m1 + (k + (cc_dim4 * 5 + 1) * cc_dim3) *
		    cc_dim2 << 1) + 2];
	    ti2 = cc[(m1 + (k + ((cc_dim4 << 1) + 1) * cc_dim3) * cc_dim2 <<
		    1) + 2] + cc[(m1 + (k + (cc_dim4 * 5 + 1) * cc_dim3) *
		    cc_dim2 << 1) + 2];
	    ti4 = cc[(m1 + (k + (cc_dim4 * 3 + 1) * cc_dim3) * cc_dim2 << 1)
		    + 2] - cc[(m1 + (k + ((cc_dim4 << 2) + 1) * cc_dim3) *
		    cc_dim2 << 1) + 2];
	    ti3 = cc[(m1 + (k + (cc_dim4 * 3 + 1) * cc_dim3) * cc_dim2 << 1)
		    + 2] + cc[(m1 + (k + ((cc_dim4 << 2) + 1) * cc_dim3) *
		    cc_dim2 << 1) + 2];
	    tr5 = cc[(m1 + (k + ((cc_dim4 << 1) + 1) * cc_dim3) * cc_dim2 <<
		    1) + 1] - cc[(m1 + (k + (cc_dim4 * 5 + 1) * cc_dim3) *
		    cc_dim2 << 1) + 1];
	    tr2 = cc[(m1 + (k + ((cc_dim4 << 1) + 1) * cc_dim3) * cc_dim2 <<
		    1) + 1] + cc[(m1 + (k + (cc_dim4 * 5 + 1) * cc_dim3) *
		    cc_dim2 << 1) + 1];
	    tr4 = cc[(m1 + (k + (cc_dim4 * 3 + 1) * cc_dim3) * cc_dim2 << 1)
		    + 1] - cc[(m1 + (k + ((cc_dim4 << 2) + 1) * cc_dim3) *
		    cc_dim2 << 1) + 1];
	    tr3 = cc[(m1 + (k + (cc_dim4 * 3 + 1) * cc_dim3) * cc_dim2 << 1)
		    + 1] + cc[(m1 + (k + ((cc_dim4 << 2) + 1) * cc_dim3) *
		    cc_dim2 << 1) + 1];
	    chold1 = cc[(m1 + (k + (cc_dim4 + 1) * cc_dim3) * cc_dim2 << 1) +
		    1] + tr2 + tr3;
	    chold2 = cc[(m1 + (k + (cc_dim4 + 1) * cc_dim3) * cc_dim2 << 1) +
		    2] + ti2 + ti3;
	    cr2 = cc[(m1 + (k + (cc_dim4 + 1) * cc_dim3) * cc_dim2 << 1) + 1]
		    + tr11 * tr2 + tr12 * tr3;
	    ci2 = cc[(m1 + (k + (cc_dim4 + 1) * cc_dim3) * cc_dim2 << 1) + 2]
		    + tr11 * ti2 + tr12 * ti3;
	    cr3 = cc[(m1 + (k + (cc_dim4 + 1) * cc_dim3) * cc_dim2 << 1) + 1]
		    + tr12 * tr2 + tr11 * tr3;
	    ci3 = cc[(m1 + (k + (cc_dim4 + 1) * cc_dim3) * cc_dim2 << 1) + 2]
		    + tr12 * ti2 + tr11 * ti3;
	    cc[(m1 + (k + (cc_dim4 + 1) * cc_dim3) * cc_dim2 << 1) + 1] =
		    chold1;
	    cc[(m1 + (k + (cc_dim4 + 1) * cc_dim3) * cc_dim2 << 1) + 2] =
		    chold2;
	    cr5 = ti11 * tr5 + ti12 * tr4;
	    ci5 = ti11 * ti5 + ti12 * ti4;
	    cr4 = ti12 * tr5 - ti11 * tr4;
	    ci4 = ti12 * ti5 - ti11 * ti4;
	    cc[(m1 + (k + ((cc_dim4 << 1) + 1) * cc_dim3) * cc_dim2 << 1) + 1]
		     = cr2 - ci5;
	    cc[(m1 + (k + (cc_dim4 * 5 + 1) * cc_dim3) * cc_dim2 << 1) + 1] =
		    cr2 + ci5;
	    cc[(m1 + (k + ((cc_dim4 << 1) + 1) * cc_dim3) * cc_dim2 << 1) + 2]
		     = ci2 + cr5;
	    cc[(m1 + (k + (cc_dim4 * 3 + 1) * cc_dim3) * cc_dim2 << 1) + 2] =
		    ci3 + cr4;
	    cc[(m1 + (k + (cc_dim4 * 3 + 1) * cc_dim3) * cc_dim2 << 1) + 1] =
		    cr3 - ci4;
	    cc[(m1 + (k + ((cc_dim4 << 2) + 1) * cc_dim3) * cc_dim2 << 1) + 1]
		     = cr3 + ci4;
	    cc[(m1 + (k + ((cc_dim4 << 2) + 1) * cc_dim3) * cc_dim2 << 1) + 2]
		     = ci3 - cr4;
	    cc[(m1 + (k + (cc_dim4 * 5 + 1) * cc_dim3) * cc_dim2 << 1) + 2] =
		    ci2 - cr5;
/* L101: */
	}
    }
    return 0;
L102:
    i__3 = *l1;
    for (k = 1; k <= i__3; ++k) {
	m2 = m2s;
	i__2 = m1d;
	i__1 = *im1;
	for (m1 = 1; i__1 < 0 ? m1 >= i__2 : m1 <= i__2; m1 += i__1) {
	    m2 += *im2;
	    ti5 = cc[(m1 + (k + ((cc_dim4 << 1) + 1) * cc_dim3) * cc_dim2 <<
		    1) + 2] - cc[(m1 + (k + (cc_dim4 * 5 + 1) * cc_dim3) *
		    cc_dim2 << 1) + 2];
	    ti2 = cc[(m1 + (k + ((cc_dim4 << 1) + 1) * cc_dim3) * cc_dim2 <<
		    1) + 2] + cc[(m1 + (k + (cc_dim4 * 5 + 1) * cc_dim3) *
		    cc_dim2 << 1) + 2];
	    ti4 = cc[(m1 + (k + (cc_dim4 * 3 + 1) * cc_dim3) * cc_dim2 << 1)
		    + 2] - cc[(m1 + (k + ((cc_dim4 << 2) + 1) * cc_dim3) *
		    cc_dim2 << 1) + 2];
	    ti3 = cc[(m1 + (k + (cc_dim4 * 3 + 1) * cc_dim3) * cc_dim2 << 1)
		    + 2] + cc[(m1 + (k + ((cc_dim4 << 2) + 1) * cc_dim3) *
		    cc_dim2 << 1) + 2];
	    tr5 = cc[(m1 + (k + ((cc_dim4 << 1) + 1) * cc_dim3) * cc_dim2 <<
		    1) + 1] - cc[(m1 + (k + (cc_dim4 * 5 + 1) * cc_dim3) *
		    cc_dim2 << 1) + 1];
	    tr2 = cc[(m1 + (k + ((cc_dim4 << 1) + 1) * cc_dim3) * cc_dim2 <<
		    1) + 1] + cc[(m1 + (k + (cc_dim4 * 5 + 1) * cc_dim3) *
		    cc_dim2 << 1) + 1];
	    tr4 = cc[(m1 + (k + (cc_dim4 * 3 + 1) * cc_dim3) * cc_dim2 << 1)
		    + 1] - cc[(m1 + (k + ((cc_dim4 << 2) + 1) * cc_dim3) *
		    cc_dim2 << 1) + 1];
	    tr3 = cc[(m1 + (k + (cc_dim4 * 3 + 1) * cc_dim3) * cc_dim2 << 1)
		    + 1] + cc[(m1 + (k + ((cc_dim4 << 2) + 1) * cc_dim3) *
		    cc_dim2 << 1) + 1];
	    ch[(m2 + (k + ch_dim3 * 6) * ch_dim2 << 1) + 1] = cc[(m1 + (k + (
		    cc_dim4 + 1) * cc_dim3) * cc_dim2 << 1) + 1] + tr2 + tr3;
	    ch[(m2 + (k + ch_dim3 * 6) * ch_dim2 << 1) + 2] = cc[(m1 + (k + (
		    cc_dim4 + 1) * cc_dim3) * cc_dim2 << 1) + 2] + ti2 + ti3;
	    cr2 = cc[(m1 + (k + (cc_dim4 + 1) * cc_dim3) * cc_dim2 << 1) + 1]
		    + tr11 * tr2 + tr12 * tr3;
	    ci2 = cc[(m1 + (k + (cc_dim4 + 1) * cc_dim3) * cc_dim2 << 1) + 2]
		    + tr11 * ti2 + tr12 * ti3;
	    cr3 = cc[(m1 + (k + (cc_dim4 + 1) * cc_dim3) * cc_dim2 << 1) + 1]
		    + tr12 * tr2 + tr11 * tr3;
	    ci3 = cc[(m1 + (k + (cc_dim4 + 1) * cc_dim3) * cc_dim2 << 1) + 2]
		    + tr12 * ti2 + tr11 * ti3;
	    cr5 = ti11 * tr5 + ti12 * tr4;
	    ci5 = ti11 * ti5 + ti12 * ti4;
	    cr4 = ti12 * tr5 - ti11 * tr4;
	    ci4 = ti12 * ti5 - ti11 * ti4;
	    ch[(m2 + (k + ch_dim3 * 7) * ch_dim2 << 1) + 1] = cr2 - ci5;
	    ch[(m2 + (k + ch_dim3 * 10) * ch_dim2 << 1) + 1] = cr2 + ci5;
	    ch[(m2 + (k + ch_dim3 * 7) * ch_dim2 << 1) + 2] = ci2 + cr5;
	    ch[(m2 + (k + (ch_dim3 << 3)) * ch_dim2 << 1) + 2] = ci3 + cr4;
	    ch[(m2 + (k + (ch_dim3 << 3)) * ch_dim2 << 1) + 1] = cr3 - ci4;
	    ch[(m2 + (k + ch_dim3 * 9) * ch_dim2 << 1) + 1] = cr3 + ci4;
	    ch[(m2 + (k + ch_dim3 * 9) * ch_dim2 << 1) + 2] = ci3 - cr4;
	    ch[(m2 + (k + ch_dim3 * 10) * ch_dim2 << 1) + 2] = ci2 - cr5;
/* L103: */
	}
    }
    if (*ido == 1) {
	return 0;
    }
    i__1 = *ido;
    for (i__ = 2; i__ <= i__1; ++i__) {
	i__2 = *l1;
	for (k = 1; k <= i__2; ++k) {
	    m2 = m2s;
	    i__3 = m1d;
	    i__4 = *im1;
	    for (m1 = 1; i__4 < 0 ? m1 >= i__3 : m1 <= i__3; m1 += i__4) {
		m2 += *im2;
		ti5 = cc[(m1 + (k + (i__ + (cc_dim4 << 1)) * cc_dim3) *
			cc_dim2 << 1) + 2] - cc[(m1 + (k + (i__ + cc_dim4 * 5)
			 * cc_dim3) * cc_dim2 << 1) + 2];
		ti2 = cc[(m1 + (k + (i__ + (cc_dim4 << 1)) * cc_dim3) *
			cc_dim2 << 1) + 2] + cc[(m1 + (k + (i__ + cc_dim4 * 5)
			 * cc_dim3) * cc_dim2 << 1) + 2];
		ti4 = cc[(m1 + (k + (i__ + cc_dim4 * 3) * cc_dim3) * cc_dim2
			<< 1) + 2] - cc[(m1 + (k + (i__ + (cc_dim4 << 2)) *
			cc_dim3) * cc_dim2 << 1) + 2];
		ti3 = cc[(m1 + (k + (i__ + cc_dim4 * 3) * cc_dim3) * cc_dim2
			<< 1) + 2] + cc[(m1 + (k + (i__ + (cc_dim4 << 2)) *
			cc_dim3) * cc_dim2 << 1) + 2];
		tr5 = cc[(m1 + (k + (i__ + (cc_dim4 << 1)) * cc_dim3) *
			cc_dim2 << 1) + 1] - cc[(m1 + (k + (i__ + cc_dim4 * 5)
			 * cc_dim3) * cc_dim2 << 1) + 1];
		tr2 = cc[(m1 + (k + (i__ + (cc_dim4 << 1)) * cc_dim3) *
			cc_dim2 << 1) + 1] + cc[(m1 + (k + (i__ + cc_dim4 * 5)
			 * cc_dim3) * cc_dim2 << 1) + 1];
		tr4 = cc[(m1 + (k + (i__ + cc_dim4 * 3) * cc_dim3) * cc_dim2
			<< 1) + 1] - cc[(m1 + (k + (i__ + (cc_dim4 << 2)) *
			cc_dim3) * cc_dim2 << 1) + 1];
		tr3 = cc[(m1 + (k + (i__ + cc_dim4 * 3) * cc_dim3) * cc_dim2
			<< 1) + 1] + cc[(m1 + (k + (i__ + (cc_dim4 << 2)) *
			cc_dim3) * cc_dim2 << 1) + 1];
		ch[(m2 + (k + (i__ * 5 + 1) * ch_dim3) * ch_dim2 << 1) + 1] =
			cc[(m1 + (k + (i__ + cc_dim4) * cc_dim3) * cc_dim2 <<
			1) + 1] + tr2 + tr3;
		ch[(m2 + (k + (i__ * 5 + 1) * ch_dim3) * ch_dim2 << 1) + 2] =
			cc[(m1 + (k + (i__ + cc_dim4) * cc_dim3) * cc_dim2 <<
			1) + 2] + ti2 + ti3;
		cr2 = cc[(m1 + (k + (i__ + cc_dim4) * cc_dim3) * cc_dim2 << 1)
			 + 1] + tr11 * tr2 + tr12 * tr3;
		ci2 = cc[(m1 + (k + (i__ + cc_dim4) * cc_dim3) * cc_dim2 << 1)
			 + 2] + tr11 * ti2 + tr12 * ti3;
		cr3 = cc[(m1 + (k + (i__ + cc_dim4) * cc_dim3) * cc_dim2 << 1)
			 + 1] + tr12 * tr2 + tr11 * tr3;
		ci3 = cc[(m1 + (k + (i__ + cc_dim4) * cc_dim3) * cc_dim2 << 1)
			 + 2] + tr12 * ti2 + tr11 * ti3;
		cr5 = ti11 * tr5 + ti12 * tr4;
		ci5 = ti11 * ti5 + ti12 * ti4;
		cr4 = ti12 * tr5 - ti11 * tr4;
		ci4 = ti12 * ti5 - ti11 * ti4;
		dr3 = cr3 - ci4;
		dr4 = cr3 + ci4;
		di3 = ci3 + cr4;
		di4 = ci3 - cr4;
		dr5 = cr2 + ci5;
		dr2 = cr2 - ci5;
		di5 = ci2 - cr5;
		di2 = ci2 + cr5;
		ch[(m2 + (k + (i__ * 5 + 2) * ch_dim3) * ch_dim2 << 1) + 1] =
			wa[i__ + wa_dim1 * 5] * dr2 - wa[i__ + wa_dim1 * 9] *
			di2;
		ch[(m2 + (k + (i__ * 5 + 2) * ch_dim3) * ch_dim2 << 1) + 2] =
			wa[i__ + wa_dim1 * 5] * di2 + wa[i__ + wa_dim1 * 9] *
			dr2;
		ch[(m2 + (k + (i__ * 5 + 3) * ch_dim3) * ch_dim2 << 1) + 1] =
			wa[i__ + wa_dim1 * 6] * dr3 - wa[i__ + wa_dim1 * 10] *
			 di3;
		ch[(m2 + (k + (i__ * 5 + 3) * ch_dim3) * ch_dim2 << 1) + 2] =
			wa[i__ + wa_dim1 * 6] * di3 + wa[i__ + wa_dim1 * 10] *
			 dr3;
		ch[(m2 + (k + (i__ * 5 + 4) * ch_dim3) * ch_dim2 << 1) + 1] =
			wa[i__ + wa_dim1 * 7] * dr4 - wa[i__ + wa_dim1 * 11] *
			 di4;
		ch[(m2 + (k + (i__ * 5 + 4) * ch_dim3) * ch_dim2 << 1) + 2] =
			wa[i__ + wa_dim1 * 7] * di4 + wa[i__ + wa_dim1 * 11] *
			 dr4;
		ch[(m2 + (k + (i__ * 5 + 5) * ch_dim3) * ch_dim2 << 1) + 1] =
			wa[i__ + (wa_dim1 << 3)] * dr5 - wa[i__ + wa_dim1 *
			12] * di5;
		ch[(m2 + (k + (i__ * 5 + 5) * ch_dim3) * ch_dim2 << 1) + 2] =
			wa[i__ + (wa_dim1 << 3)] * di5 + wa[i__ + wa_dim1 *
			12] * dr5;
/* L104: */
	    }
	}
/* L105: */
    }
    return 0;
}